

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WhiteRoomFive.cpp
# Opt level: O3

string * __thiscall
WhiteRoomFive::getDescription_abi_cxx11_
          (string *__return_storage_ptr__,WhiteRoomFive *this,bool longform)

{
  pointer pcVar1;
  itemLocation iVar2;
  ItemWrapper *this_00;
  string *psVar3;
  long lVar4;
  itemType local_1c;
  
  local_1c = WHITE_KEY;
  this_00 = ItemTable::getValue((this->super_Room).table,&local_1c);
  iVar2 = ItemWrapper::getLocation(this_00);
  if (iVar2 == HIDDEN) {
    psVar3 = &(this->super_Room).rstate2;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    lVar4 = 0x50;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (longform) {
      psVar3 = &(this->super_Room).rstate0;
      lVar4 = 0x10;
    }
    else {
      psVar3 = &(this->super_Room).rstate1;
      lVar4 = 0x30;
    }
  }
  pcVar1 = (psVar3->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,
             pcVar1 + *(long *)((long)&(this->super_Room)._vptr_Room + lVar4));
  return __return_storage_ptr__;
}

Assistant:

std::string WhiteRoomFive::getDescription(bool longform) {
    if(table->getValue(WHITE_KEY)->getLocation() == HIDDEN){
        return rstate2;
    }
    else if(longform){
        return rstate0;
    }
    else {
        return rstate1;
    }
}